

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O2

string * __thiscall
font2svg::glyph::svgborder_abi_cxx11_(string *__return_storage_ptr__,glyph *this)

{
  ostream *poVar1;
  allocator<char> local_41;
  string local_40 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_40,"",&local_41);
  std::__cxx11::stringbuf::str((string *)&this->field_0x278);
  std::__cxx11::string::~string(local_40);
  std::operator<<((ostream *)&this->field_0x270,"\n\n <!-- draw border -->");
  poVar1 = std::operator<<((ostream *)&this->field_0x270,"\n <rect fill=\'none\' stroke=\'black\'");
  poVar1 = std::operator<<(poVar1," width=\'");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->bbwidth + -1);
  poVar1 = std::operator<<(poVar1,"\'");
  poVar1 = std::operator<<(poVar1," height=\'");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->bbheight + -1);
  std::operator<<(poVar1,"\'/>");
  std::__cxx11::stringbuf::str();
  return __return_storage_ptr__;
}

Assistant:

std::string svgborder()  {
		tmp.str("");
		tmp << "\n\n <!-- draw border -->";

		tmp << "\n <rect fill='none' stroke='black'"
			<< " width='" << bbwidth - 1 << "'"
			<< " height='" << bbheight - 1 << "'/>";
		return tmp.str();
	}